

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  ScopedElement *this_00;
  ScopedElement *this_01;
  string *in_RDI;
  TestGroupStats *in_stack_fffffffffffffef8;
  allocator *paVar1;
  StreamingReporterBase *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *name;
  ScopedElement *in_stack_ffffffffffffff10;
  XmlWriter *this_02;
  XmlWriter *this_03;
  allocator local_c1;
  string local_c0 [39];
  undefined1 local_99 [40];
  allocator local_71;
  string local_70 [55];
  
  StreamingReporterBase::testGroupEnded(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  this_02 = (XmlWriter *)&in_RDI[0xe].field_2;
  this_03 = (XmlWriter *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"OverallResults",(allocator *)this_03);
  XmlWriter::scopedElement(this_02,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"successes",&local_71);
  this_00 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       (unsigned_long *)in_stack_ffffffffffffff00);
  name = (string *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_99 + 1),"failures",(allocator *)name);
  this_01 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      (this_00,name,(unsigned_long *)in_stack_ffffffffffffff00);
  paVar1 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"expectedFailures",paVar1);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>(this_00,name,(unsigned_long *)this_01);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  XmlWriter::ScopedElement::~ScopedElement(this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  XmlWriter::endElement(this_03);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) {
            StreamingReporterBase::testGroupEnded( testGroupStats );
            // TODO: Check testGroupStats.aborting and act accordingly.
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
                .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
                .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
            m_xml.endElement();
        }